

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ParserDPOMDPFormat_Spirit
          (ParserDPOMDPFormat_Spirit *this,DecPOMDPDiscrete *problem)

{
  _func_int **in_RSI;
  ParserInterface *in_RDI;
  
  ParserInterface::ParserInterface(in_RDI);
  in_RDI->_vptr_ParserInterface = (_func_int **)&PTR__ParserDPOMDPFormat_Spirit_00d33700;
  in_RDI[1]._vptr_ParserInterface = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0xa00a0d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa00a1d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa00a2d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa00a3d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa00a4d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa00a5d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa00a6d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa00a7d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa00a8d);
  *(undefined1 *)&in_RDI[0xf]._vptr_ParserInterface = 1;
  *(undefined1 *)&in_RDI[0x13]._vptr_ParserInterface = 0;
  *(undefined1 *)&in_RDI[0x29]._vptr_ParserInterface = 0;
  in_RDI[9]._vptr_ParserInterface = (_func_int **)0x0;
  return;
}

Assistant:

ParserDPOMDPFormat_Spirit::ParserDPOMDPFormat_Spirit(DecPOMDPDiscrete* problem) :
//    UNIFORMTOK(this),
    _m_decPOMDPDiscrete(problem)
{
    if(DEBUG_PARSE)
    {
        cout << "Creating parser, referring to problem...";
        cout << problem->MultiAgentDecisionProcess::SoftPrint();
        cout << endl;
    }
    //need to reset the parse matrix the first time...
    _m_matrixModified = true;
    _m_identListModified = false;
    _m_startStateListExclude = false;
    _m_nrA = 0;
 //   UNIFORMTOK = uniformtok(this);

}